

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O1

iterator __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>
::find(sherwood_v3_table<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>
       *this,DiagCode *key)

{
  EntryPointer psVar1;
  DiagCode DVar2;
  EntryPointer psVar3;
  EntryPointer psVar4;
  char cVar5;
  ulong uVar6;
  
  uVar6 = (ulong)CONCAT22(key->subsystem,key->code) * -0x61c8864680b583eb >>
          ((this->hash_policy).shift & 0x3fU);
  psVar3 = this->entries;
  if (-1 < psVar3[uVar6].distance_from_desired) {
    cVar5 = '\0';
    psVar4 = psVar3 + uVar6;
    do {
      DVar2 = (psVar4->field_1).value.first;
      if (key->subsystem == DVar2.subsystem && (uint)DVar2 >> 0x10 == (uint)key->code) {
        return (iterator)psVar4;
      }
      cVar5 = cVar5 + '\x01';
      psVar1 = psVar4 + 1;
      psVar4 = psVar4 + 1;
    } while (cVar5 <= psVar1->distance_from_desired);
  }
  return (iterator)(psVar3 + this->num_slots_minus_one + (long)this->max_lookups);
}

Assistant:

size_t operator()(const slang::DiagCode& dc) const {
        return (((size_t)dc.getSubsystem()) << 16) | dc.getCode();
    }